

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

void __thiscall wabt::TypeChecker::PushTypes(TypeChecker *this,TypeVector *types)

{
  bool bVar1;
  reference pTVar2;
  const_iterator cStack_30;
  Type type;
  const_iterator __end1;
  const_iterator __begin1;
  TypeVector *__range1;
  TypeVector *types_local;
  TypeChecker *this_local;
  
  __end1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(types);
  cStack_30 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(types);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
             ::operator*(&__end1);
    PushType(this,*pTVar2);
    __gnu_cxx::
    __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void TypeChecker::PushTypes(const TypeVector& types) {
  for (Type type : types) {
    PushType(type);
  }
}